

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_ftmad_h_aarch64(void *vd,void *vn,void *vm,void *vs,uint32_t desc)

{
  float16 fVar1;
  int32_t iVar2;
  int iVar3;
  ulong uVar4;
  long local_70;
  intptr_t xx;
  float16 mm;
  float16 *m;
  float16 *n;
  float16 *d;
  intptr_t x;
  intptr_t opr_sz;
  intptr_t i;
  uint32_t desc_local;
  void *vs_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  uVar4 = simd_oprsz(desc);
  iVar2 = simd_data(desc);
  for (opr_sz = 0; opr_sz < (long)(uVar4 >> 1); opr_sz = opr_sz + 1) {
    xx._6_2_ = *(float16 *)((long)vm + opr_sz * 2);
    iVar3 = float16_is_neg(xx._6_2_);
    local_70 = (long)iVar2;
    if (iVar3 != 0) {
      xx._6_2_ = float16_abs(xx._6_2_);
      local_70 = (long)iVar2 + 8;
    }
    fVar1 = float16_muladd_aarch64
                      (*(float16 *)((long)vn + opr_sz * 2),xx._6_2_,
                       helper_sve_ftmad_h_aarch64::coeff[local_70],0,(float_status *)vs);
    *(float16 *)((long)vd + opr_sz * 2) = fVar1;
  }
  return;
}

Assistant:

void HELPER(sve_ftmad_h)(void *vd, void *vn, void *vm, void *vs, uint32_t desc)
{
    static const float16 coeff[16] = {
        0x3c00, 0xb155, 0x2030, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000,
        0x3c00, 0xb800, 0x293a, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000,
    };
    intptr_t i, opr_sz = simd_oprsz(desc) / sizeof(float16);
    intptr_t x = simd_data(desc);
    float16 *d = vd, *n = vn, *m = vm;
    for (i = 0; i < opr_sz; i++) {
        float16 mm = m[i];
        intptr_t xx = x;
        if (float16_is_neg(mm)) {
            mm = float16_abs(mm);
            xx += 8;
        }
        d[i] = float16_muladd(n[i], mm, coeff[xx], 0, vs);
    }
}